

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_timer.hxx
# Opt level: O2

uint64_t __thiscall nuraft::timer_helper::get_us(timer_helper *this)

{
  long lVar1;
  ulong uVar2;
  double dVar3;
  
  std::mutex::lock(&this->lock_);
  lVar1 = std::chrono::_V2::system_clock::now();
  dVar3 = ((double)(lVar1 - (this->t_created_).__d.__r) / 1000000000.0) * 1000000.0;
  uVar2 = (ulong)dVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
}

Assistant:

uint64_t get_us() {
        std::lock_guard<std::mutex> l(lock_);
        auto cur = std::chrono::system_clock::now();
        std::chrono::duration<double> elapsed = cur - t_created_;
        return (uint64_t)(1000000 * elapsed.count());
    }